

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void event_disable_debug_mode(void)

{
  event_debug_entry *ptr;
  event_debug_entry *victim;
  event_debug_entry **ent;
  
  if (event_debug_map_lock_ != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,event_debug_map_lock_);
  }
  victim = (event_debug_entry *)event_debug_map_HT_START(&global_debug_map);
  while (victim != (event_debug_entry *)0x0) {
    ptr = (victim->node).hte_next;
    victim = (event_debug_entry *)
             event_debug_map_HT_NEXT_RMV(&global_debug_map,(event_debug_entry **)victim);
    event_mm_free_(ptr);
  }
  event_debug_map_HT_CLEAR(&global_debug_map);
  if (event_debug_map_lock_ != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,event_debug_map_lock_);
  }
  event_debug_mode_on_ = 0;
  return;
}

Assistant:

void
event_disable_debug_mode(void)
{
#ifndef EVENT__DISABLE_DEBUG_MODE
	struct event_debug_entry **ent, *victim;

	EVLOCK_LOCK(event_debug_map_lock_, 0);
	for (ent = HT_START(event_debug_map, &global_debug_map); ent; ) {
		victim = *ent;
		ent = HT_NEXT_RMV(event_debug_map, &global_debug_map, ent);
		mm_free(victim);
	}
	HT_CLEAR(event_debug_map, &global_debug_map);
	EVLOCK_UNLOCK(event_debug_map_lock_ , 0);

	event_debug_mode_on_  = 0;
#endif
}